

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_GetHttpResponse
              (void *Handle,UpnpString *headers,char **contentType,int *contentLength,
              int *httpStatus,int timeout)

{
  int iVar1;
  parse_status_t pVar2;
  http_header_t *phVar3;
  parse_status_t status;
  http_connection_handle_t *handle;
  memptr ctype;
  int local_38;
  int http_error_code;
  int ret_code;
  int timeout_local;
  int *httpStatus_local;
  int *contentLength_local;
  char **contentType_local;
  UpnpString *headers_local;
  void *Handle_local;
  
  http_error_code = timeout;
  _ret_code = httpStatus;
  httpStatus_local = contentLength;
  contentLength_local = (int *)contentType;
  contentType_local = (char **)headers;
  headers_local = (UpnpString *)Handle;
  iVar1 = ReadResponseLineAndHeaders
                    ((SOCKINFO *)Handle,(http_parser_t *)((long)Handle + 0x90),&http_error_code,
                     (int *)((long)&ctype.length + 4));
  if (iVar1 == 4) {
    pVar2 = parser_get_entity_read_method((http_parser_t *)((long)Handle + 0x90));
    if ((pVar2 == PARSE_SUCCESS) || (pVar2 == PARSE_CONTINUE_1)) {
      local_38 = 0;
      if (_ret_code != (int *)0x0) {
        *_ret_code = *(int *)((long)Handle + 0x16c);
      }
      if (contentLength_local != (int *)0x0) {
        phVar3 = httpmsg_find_hdr((http_message_t *)((long)Handle + 0x90),4,(memptr *)&handle);
        if (phVar3 == (http_header_t *)0x0) {
          contentLength_local[0] = 0;
          contentLength_local[1] = 0;
        }
        else {
          *(http_connection_handle_t **)contentLength_local = handle;
        }
      }
      if (httpStatus_local != (int *)0x0) {
        if (*(int *)((long)Handle + 0x248) == 4) {
          *httpStatus_local = 0;
        }
        else if (*(int *)((long)Handle + 0x24c) == 3) {
          *httpStatus_local = -3;
        }
        else if (*(int *)((long)Handle + 0x24c) == 2) {
          *httpStatus_local = *(int *)((long)Handle + 0x250);
        }
        else if (*(int *)((long)Handle + 0x24c) == 4) {
          *httpStatus_local = -4;
        }
      }
      if (contentType_local != (char **)0x0) {
        copy_msg_headers((LinkedList *)((long)Handle + 0x1a8),(UpnpString *)contentType_local);
      }
    }
    else {
      local_38 = -0x71;
    }
  }
  else {
    local_38 = -0x71;
  }
  if (local_38 != 0) {
    httpmsg_destroy((http_message_t *)((long)Handle + 0x90));
  }
  return local_38;
}

Assistant:

int http_GetHttpResponse(void *Handle,
	UpnpString *headers,
	char **contentType,
	int *contentLength,
	int *httpStatus,
	int timeout)
{
	int ret_code;
	int http_error_code;
	memptr ctype;
	http_connection_handle_t *handle = Handle;
	parse_status_t status;

	status = ReadResponseLineAndHeaders(&handle->sock_info,
		&handle->response,
		&timeout,
		&http_error_code);
	if (status != (parse_status_t)PARSE_OK) {
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	status = parser_get_entity_read_method(&handle->response);
	switch (status) {
	case PARSE_CONTINUE_1:
	case PARSE_SUCCESS:
		break;
	default:
		ret_code = UPNP_E_BAD_RESPONSE;
		goto errorHandler;
	}
	ret_code = UPNP_E_SUCCESS;
	if (httpStatus) {
		*httpStatus = handle->response.msg.status_code;
	}
	if (contentType) {
		if (!httpmsg_find_hdr(
			    &handle->response.msg, HDR_CONTENT_TYPE, &ctype))
			/* no content-type */
			*contentType = NULL;
		else
			*contentType = ctype.buf;
	}
	if (contentLength) {
		if (handle->response.position == (parser_pos_t)POS_COMPLETE)
			*contentLength = 0;
		else if (handle->response.ent_position == ENTREAD_USING_CHUNKED)
			*contentLength = UPNP_USING_CHUNKED;
		else if (handle->response.ent_position == ENTREAD_USING_CLEN)
			*contentLength = (int)handle->response.content_length;
		else if (handle->response.ent_position == ENTREAD_UNTIL_CLOSE)
			*contentLength = UPNP_UNTIL_CLOSE;
	}

	if (headers) {
		copy_msg_headers(&handle->response.msg.headers, headers);
	}

errorHandler:
	if (ret_code != UPNP_E_SUCCESS)
		httpmsg_destroy(&handle->response.msg);
	return ret_code;
}